

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall httplib::detail::scope_exit::~scope_exit(scope_exit *this)

{
  function<void_()> *in_RDI;
  
  if ((in_RDI[1].super__Function_base._M_functor._M_pod_data[0] & 1U) != 0) {
    std::function<void_()>::operator()(in_RDI);
  }
  std::function<void_()>::~function((function<void_()> *)0x19d4e1);
  return;
}

Assistant:

~scope_exit() {
    if (execute_on_destruction) { this->exit_function(); }
  }